

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O0

string * __thiscall
re2::PrefilterTree::DebugNodeString_abi_cxx11_(PrefilterTree *this,Prefilter *node)

{
  ulong uVar1;
  byte bVar2;
  Op OVar3;
  uint uVar4;
  string *psVar5;
  vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *pvVar6;
  size_type sVar7;
  reference ppPVar8;
  PrefilterTree *in_RDX;
  char *pcVar9;
  string *in_RDI;
  size_t i;
  string *node_string;
  Prefilter *in_stack_ffffffffffffff20;
  string local_78 [32];
  string local_58 [32];
  ulong local_38;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar10;
  
  uVar10 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",(allocator *)&stack0xffffffffffffffe6);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe6);
  OVar3 = Prefilter::op((Prefilter *)in_RDX);
  if (OVar3 == ATOM) {
    Prefilter::atom_abi_cxx11_((Prefilter *)in_RDX);
    bVar2 = std::__cxx11::string::empty();
    if (((bVar2 ^ 0xff) & 1) == 0) {
      __assert_fail("!node->atom().empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
                    ,0x176,"std::string re2::PrefilterTree::DebugNodeString(Prefilter *) const");
    }
    psVar5 = Prefilter::atom_abi_cxx11_((Prefilter *)in_RDX);
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)psVar5);
  }
  else {
    OVar3 = Prefilter::op((Prefilter *)in_RDX);
    pcVar9 = "OR";
    if (OVar3 == AND) {
      pcVar9 = "AND";
    }
    std::__cxx11::string::operator+=((string *)in_RDI,pcVar9);
    std::__cxx11::string::operator+=((string *)in_RDI,"(");
    local_38 = 0;
    while( true ) {
      uVar1 = local_38;
      pvVar6 = Prefilter::subs(in_stack_ffffffffffffff20);
      sVar7 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::size(pvVar6);
      if (sVar7 <= uVar1) break;
      if (local_38 != 0) {
        std::__cxx11::string::operator+=((string *)in_RDI,',');
      }
      pvVar6 = Prefilter::subs(in_stack_ffffffffffffff20);
      ppPVar8 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                          (pvVar6,local_38);
      uVar4 = Prefilter::unique_id(*ppPVar8);
      StringPrintf_abi_cxx11_((char *)local_58,"%d",(ulong)uVar4);
      std::__cxx11::string::operator+=((string *)in_RDI,local_58);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::operator+=((string *)in_RDI,":");
      in_stack_ffffffffffffff20 = (Prefilter *)Prefilter::subs(in_stack_ffffffffffffff20);
      std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                ((vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *)
                 in_stack_ffffffffffffff20,local_38);
      DebugNodeString_abi_cxx11_(in_RDX,(Prefilter *)CONCAT17(uVar10,in_stack_ffffffffffffffe0));
      std::__cxx11::string::operator+=((string *)in_RDI,local_78);
      std::__cxx11::string::~string(local_78);
      local_38 = local_38 + 1;
    }
    std::__cxx11::string::operator+=((string *)in_RDI,")");
  }
  return in_RDI;
}

Assistant:

std::string PrefilterTree::DebugNodeString(Prefilter* node) const {
  std::string node_string = "";
  if (node->op() == Prefilter::ATOM) {
    DCHECK(!node->atom().empty());
    node_string += node->atom();
  } else {
    // Adding the operation disambiguates AND and OR nodes.
    node_string +=  node->op() == Prefilter::AND ? "AND" : "OR";
    node_string += "(";
    for (size_t i = 0; i < node->subs()->size(); i++) {
      if (i > 0)
        node_string += ',';
      node_string += StringPrintf("%d", (*node->subs())[i]->unique_id());
      node_string += ":";
      node_string += DebugNodeString((*node->subs())[i]);
    }
    node_string += ")";
  }
  return node_string;
}